

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ThrowException(XFileParser *this,string *pText)

{
  bool bVar1;
  DeadlyImportError *this_00;
  ostream *poVar2;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  bVar1 = this->mIsBinaryFormat;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  if (bVar1 == true) {
    DeadlyImportError::DeadlyImportError(this_00,pText);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"Line ");
  poVar2 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198
                      ,&this->mLineNumber);
  std::operator<<(poVar2,": ");
  std::operator<<(poVar2,(string *)pText);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_00,&sStack_1b8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void XFileParser::ThrowException( const std::string& pText) {
    if ( mIsBinaryFormat ) {
        throw DeadlyImportError( pText );
    } else {
        throw DeadlyImportError( format() << "Line " << mLineNumber << ": " << pText );
    }
}